

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result wabt::anon_unknown_1::CheckTypes
                 (Location *loc,TypeVector *actual,TypeVector *expected,char *desc,char *index_kind,
                 Errors *errors)

{
  Type TVar1;
  Type TVar2;
  undefined8 uVar3;
  pointer pTVar4;
  size_t i;
  ulong uVar5;
  pointer pTVar6;
  Enum EVar7;
  ErrorLevel local_cc;
  TypeVector *local_c8;
  char *local_c0;
  Location *local_b8;
  vector<wabt::Error,std::allocator<wabt::Error>> *local_b0;
  TypeVector *local_a8;
  Type local_a0;
  Type local_98;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pTVar4 = (actual->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pTVar6 = (actual->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  local_a8 = actual;
  if ((long)pTVar6 - (long)pTVar4 >> 3 ==
      (long)(expected->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(expected->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
            super__Vector_impl_data._M_start >> 3) {
    EVar7 = Ok;
    local_c8 = expected;
    local_c0 = desc;
    local_b8 = loc;
    local_b0 = (vector<wabt::Error,std::allocator<wabt::Error>> *)index_kind;
    for (uVar5 = 0; uVar5 < (ulong)((long)pTVar6 - (long)pTVar4 >> 3); uVar5 = uVar5 + 1) {
      TVar1 = pTVar4[uVar5];
      TVar2 = (expected->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
              super__Vector_impl_data._M_start[uVar5];
      if (TVar1 != TVar2) {
        local_cc = Error;
        local_a0 = TVar2;
        local_98 = TVar1;
        Type::GetName_abi_cxx11_(&local_90,&local_98);
        uVar3 = CONCAT44(local_90._M_dataplus._M_p._4_4_,local_90._M_dataplus._M_p._0_4_);
        Type::GetName_abi_cxx11_(&local_70,&local_a0);
        StringPrintf_abi_cxx11_
                  (&local_50,"type mismatch for %s %u of %s. got %s, expected %s",local_c0,
                   uVar5 & 0xffffffff,"function",uVar3,local_70._M_dataplus._M_p);
        std::vector<wabt::Error,std::allocator<wabt::Error>>::
        emplace_back<wabt::ErrorLevel,wabt::Location_const&,std::__cxx11::string>
                  (local_b0,&local_cc,local_b8,&local_50);
        std::__cxx11::string::_M_dispose();
        std::__cxx11::string::_M_dispose();
        std::__cxx11::string::_M_dispose();
        pTVar4 = (local_a8->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pTVar6 = (local_a8->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        expected = local_c8;
      }
      EVar7 = (Enum)(EVar7 != Ok || TVar1 != TVar2);
    }
  }
  else {
    local_90._M_dataplus._M_p._0_4_ = 1;
    StringPrintf_abi_cxx11_(&local_50,"expected %zd %ss, got %zd");
    std::vector<wabt::Error,std::allocator<wabt::Error>>::
    emplace_back<wabt::ErrorLevel,wabt::Location_const&,std::__cxx11::string>
              ((vector<wabt::Error,std::allocator<wabt::Error>> *)index_kind,(ErrorLevel *)&local_90
               ,loc,&local_50);
    std::__cxx11::string::_M_dispose();
    EVar7 = Error;
  }
  return (Result)EVar7;
}

Assistant:

Result CheckTypes(const Location& loc,
                  const TypeVector& actual,
                  const TypeVector& expected,
                  const char* desc,
                  const char* index_kind,
                  Errors* errors) {
  Result result = Result::Ok;
  if (actual.size() == expected.size()) {
    for (size_t i = 0; i < actual.size(); ++i) {
      result |= CheckTypeIndex(loc, actual[i], expected[i], desc, i, index_kind,
                               errors);
    }
  } else {
    errors->emplace_back(
        ErrorLevel::Error, loc,
        StringPrintf("expected %" PRIzd " %ss, got %" PRIzd, expected.size(),
                     index_kind, actual.size()));
    result = Result::Error;
  }
  return result;
}